

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UChar32 __thiscall icu_63::Normalizer2Impl::composePair(Normalizer2Impl *this,UChar32 a,UChar32 b)

{
  UBool UVar1;
  uint16_t norm16_00;
  int iVar2;
  int32_t iVar3;
  uint16_t *local_30;
  uint16_t *list;
  uint16_t norm16;
  UChar32 b_local;
  UChar32 a_local;
  Normalizer2Impl *this_local;
  
  norm16_00 = getNorm16(this,a);
  UVar1 = isInert(norm16_00);
  if (UVar1 != '\0') {
    return -1;
  }
  if (norm16_00 < this->minYesNoMappingsOnly) {
    UVar1 = isJamoL(norm16_00);
    if (UVar1 != '\0') {
      iVar2 = b + -0x1161;
      if ((-1 < iVar2) && (iVar2 < 0x15)) {
        return ((a + -0x1100) * 0x15 + iVar2) * 0x1c + 0xac00;
      }
      return -1;
    }
    UVar1 = isHangulLV(this,norm16_00);
    if (UVar1 != '\0') {
      iVar2 = b + -0x11a7;
      if ((0 < iVar2) && (iVar2 < 0x1c)) {
        return a + iVar2;
      }
      return -1;
    }
    local_30 = getMapping(this,norm16_00);
    if (this->minYesNo < norm16_00) {
      local_30 = local_30 + (int)((*local_30 & 0x1f) + 1);
    }
  }
  else {
    if ((norm16_00 < this->minMaybeYes) || (0xfbff < norm16_00)) {
      return -1;
    }
    local_30 = getCompositionsListForMaybe(this,norm16_00);
  }
  if ((b < 0) || (0x10ffff < b)) {
    this_local._4_4_ = -1;
  }
  else {
    iVar3 = combine(local_30,b);
    this_local._4_4_ = iVar3 >> 1;
  }
  return this_local._4_4_;
}

Assistant:

UChar32
Normalizer2Impl::composePair(UChar32 a, UChar32 b) const {
    uint16_t norm16=getNorm16(a);  // maps an out-of-range 'a' to inert norm16
    const uint16_t *list;
    if(isInert(norm16)) {
        return U_SENTINEL;
    } else if(norm16<minYesNoMappingsOnly) {
        // a combines forward.
        if(isJamoL(norm16)) {
            b-=Hangul::JAMO_V_BASE;
            if(0<=b && b<Hangul::JAMO_V_COUNT) {
                return
                    (Hangul::HANGUL_BASE+
                     ((a-Hangul::JAMO_L_BASE)*Hangul::JAMO_V_COUNT+b)*
                     Hangul::JAMO_T_COUNT);
            } else {
                return U_SENTINEL;
            }
        } else if(isHangulLV(norm16)) {
            b-=Hangul::JAMO_T_BASE;
            if(0<b && b<Hangul::JAMO_T_COUNT) {  // not b==0!
                return a+b;
            } else {
                return U_SENTINEL;
            }
        } else {
            // 'a' has a compositions list in extraData
            list=getMapping(norm16);
            if(norm16>minYesNo) {  // composite 'a' has both mapping & compositions list
                list+=  // mapping pointer
                    1+  // +1 to skip the first unit with the mapping length
                    (*list&MAPPING_LENGTH_MASK);  // + mapping length
            }
        }
    } else if(norm16<minMaybeYes || MIN_NORMAL_MAYBE_YES<=norm16) {
        return U_SENTINEL;
    } else {
        list=getCompositionsListForMaybe(norm16);
    }
    if(b<0 || 0x10ffff<b) {  // combine(list, b) requires a valid code point b
        return U_SENTINEL;
    }
#if U_SIGNED_RIGHT_SHIFT_IS_ARITHMETIC
    return combine(list, b)>>1;
#else
    int32_t compositeAndFwd=combine(list, b);
    return compositeAndFwd>=0 ? compositeAndFwd>>1 : U_SENTINEL;
#endif
}